

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

size_t string_last_index_of_char(pString str,char sub,size_t start,size_t count)

{
  char *local_40;
  char *right;
  char *left;
  size_t count_local;
  size_t start_local;
  char sub_local;
  pString str_local;
  
  if (start + 1 < count) {
    printf("string_last_index_of_char: index out of range\n");
    exit(1);
  }
  if (str->len < start) {
    printf("string_last_index_of_char: index out of range\n");
    exit(1);
  }
  if (count != 0) {
    left = (char *)count;
    count_local = start;
    if (start == str->len) {
      if (str->len == 0) {
        return 0xffffffffffffffff;
      }
      count_local = start - 1;
      left = (char *)(count - 1);
    }
    for (local_40 = str->buf + count_local; str->buf + (count_local - (long)left) + 1 <= local_40;
        local_40 = local_40 + -1) {
      if (*local_40 == sub) {
        return (size_t)(local_40 + -(long)str->buf);
      }
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t string_last_index_of_char(pString str, char sub, size_t start, size_t count)
{
    if (start + 1 < count)
    {
        log("string_last_index_of_char: index out of range");
        exit(1);
    }
    if (start > str->len)
    {
        log("string_last_index_of_char: index out of range");
        exit(1);
    }
    if (count == 0)
    {
        return STR_ERROR;
    }
    if (start == str->len)
    {
        if (str->len == 0)
        {
            return STR_ERROR;
        }
        else
        {
            start--;
            count--;
        }
    }

    char *left = str->buf + start - count + 1;
    char *right = str->buf + start - 1 + 1;
    while (left <= right)
    {
        if (*right == sub)
            return right - str->buf;
        right--;
    }
    return STR_ERROR;
}